

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O2

bool __thiscall llvm::detail::IEEEFloat::isSmallest(IEEEFloat *this)

{
  uint uVar1;
  
  if (((this->field_0x12 & 7) != 3 && (this->field_0x12 & 6) != 0) &&
     (this->exponent == this->semantics->minExponent)) {
    uVar1 = significandMSB(this);
    return uVar1 == 0;
  }
  return false;
}

Assistant:

bool isNaN() const { return category == fcNaN; }